

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

Result __thiscall
testing::internal::
FunctionMocker<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
::PerformDefaultAction
          (FunctionMocker<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
           *this,ArgumentTuple *args,string *call_description)

{
  pointer pcVar1;
  Result pvVar2;
  OnCallSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  *this_00;
  Action<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  *pAVar3;
  Result pvVar4;
  runtime_error *this_01;
  string message;
  long *local_38 [2];
  long local_28 [2];
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 !=
      (OnCallSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
       *)0x0) {
    pAVar3 = OnCallSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
             ::GetAction(this_00);
    pvVar4 = Action<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
             ::Perform(pAVar3);
    return pvVar4;
  }
  pcVar1 = (call_description->_M_dataplus)._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar1,pcVar1 + call_description->_M_string_length);
  std::__cxx11::string::append((char *)local_38);
  pvVar2 = DefaultValue<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>const&>
           ::address_;
  if (DefaultValue<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>const&>
      ::address_ != (Result)0x0) {
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
    return pvVar2;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,(string *)local_38);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }